

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
::init(ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
       *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  char *__s;
  size_t sVar3;
  int numBytes;
  int numBytes_00;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  long lVar2;
  
  iVar1 = (*((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
             ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>::
  init(&this->
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
       ,ctx);
  local_1a0 = (undefined1  [8])((ulong)local_1a0 & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_zeroData,
             (long)(this->
                   super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                   ).m_bufferSizeMax,local_1a0);
  local_1a0 = (undefined1  [8])
              ((this->
               super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
               ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Testing performance with ",0x19);
  std::ostream::operator<<((ostringstream *)&local_198,0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,
             " test samples. Sample order is randomized. All samples at even positions (first = 0) are tested before samples at odd positions.\n"
             ,0x81);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Buffer sizes are in range [",0x1b);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1c0,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                          ).m_bufferSizeMin,numBytes);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,", ",2);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1e0,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                          ).m_bufferSizeMax,numBytes_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"].",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  local_1a0 = (undefined1  [8])
              ((this->
               super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
               ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Test result is the median transfer rate of the test samples.\n",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"Buffer usage = ",0xf);
  __s = glu::getUsageName(this->m_bufferUsage);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,__s,sVar3);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  (**(code **)(lVar2 + 0x1680))
            ((((this->
               super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
               ).m_dummyProgram)->m_program).m_program);
  (**(code **)(lVar2 + 0x1a00))(0,0,0x20,0x20);
  iVar1 = (**(code **)(lVar2 + 0x610))
                    ((this->
                     super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                     ).m_dummyProgramPosLoc);
  return iVar1;
}

Assistant:

void ModifyAfterBasicCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// init parent

	BasicBufferCase<SampleType>::init();

	// upload source
	m_zeroData.resize(m_bufferSizeMax, 0x00);

	// log basic info

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing performance with " << (int)NUM_SAMPLES << " test samples. Sample order is randomized. All samples at even positions (first = 0) are tested before samples at odd positions.\n"
		<< "Buffer sizes are in range [" << getHumanReadableByteSize(m_bufferSizeMin) << ", " << getHumanReadableByteSize(m_bufferSizeMax) << "]."
		<< tcu::TestLog::EndMessage;

	// log which transfer rate is the test result and buffer info

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Test result is the median transfer rate of the test samples.\n"
		<< "Buffer usage = " << glu::getUsageName(m_bufferUsage)
		<< tcu::TestLog::EndMessage;

	// Set state for drawing so that we don't have to change these during the iteration
	{
		gl.useProgram(m_dummyProgram->getProgram());
		gl.viewport(0, 0, DUMMY_RENDER_AREA_SIZE, DUMMY_RENDER_AREA_SIZE);
		gl.enableVertexAttribArray(m_dummyProgramPosLoc);
	}
}